

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O2

void P_UpdatePortal(FLinePortal *port)

{
  uint uVar1;
  line_t *plVar2;
  vertex_t *pvVar3;
  DVector2 DVar4;
  double dVar5;
  double dVar6;
  byte bVar7;
  line_t *plVar8;
  undefined1 auStack_58 [16];
  double dStack_48;
  double dStack_40;
  double dStack_38;
  double dStack_30;
  
  plVar2 = port->mDestination;
  if (plVar2 == (line_t *)0x0) {
    port->mFlags = '\0';
    SetRotation(port);
    return;
  }
  uVar1 = plVar2->portalindex;
  if (uVar1 < linePortals.Count) {
    plVar8 = linePortals.Array[uVar1].mDestination;
  }
  else {
    plVar8 = (line_t *)0x0;
  }
  if (plVar8 == port->mOrigin) {
    port->mFlags = port->mDefFlags;
    if (port->mType == '\x03') {
      if (linePortals.Array[uVar1].mType != '\x03') {
        port->mType = '\x02';
        SetRotation(port);
        return;
      }
      pvVar3 = port->mOrigin->v1;
      dVar5 = (plVar2->v2->p).Y - (pvVar3->p).Y;
      DVar4.Y._0_4_ = SUB84(dVar5,0);
      DVar4.X = (plVar2->v2->p).X - (pvVar3->p).X;
      DVar4.Y._4_4_ = (int)((ulong)dVar5 >> 0x20);
      port->mDisplacement = DVar4;
      SetRotation(port);
      return;
    }
  }
  else {
    bVar7 = port->mDefFlags & 0xf7;
    port->mFlags = bVar7;
    if (port->mType == '\x03') {
      port->mType = '\x01';
      port->mDefFlags = bVar7;
      SetRotation(port);
      return;
    }
  }
  if ((port != (FLinePortal *)0x0) && (plVar2 = port->mDestination, plVar2 != (line_t *)0x0)) {
    if (port->mType == '\x03') {
      port->mCosRot = 1.0;
      (port->mAngleDiff).Degrees = 0.0;
      port->mSinRot = 0.0;
    }
    else {
      plVar8 = port->mOrigin;
      dStack_38 = (plVar2->delta).X;
      dStack_30 = (plVar2->delta).Y;
      TVector2<double>::Angle((TVector2<double> *)(auStack_58 + 8));
      dStack_48 = (plVar8->delta).X;
      dStack_40 = (plVar8->delta).Y;
      TVector2<double>::Angle((TVector2<double> *)auStack_58);
      dVar5 = ((double)auStack_58._8_8_ - (double)auStack_58._0_8_) + 180.0;
      dVar6 = sindeg(dVar5);
      port->mSinRot = dVar6;
      dVar6 = cosdeg(dVar5);
      port->mCosRot = dVar6;
      (port->mAngleDiff).Degrees = dVar5;
      if (((plVar8->sidedef[0]->Flags & 0x40) == 0) && ((plVar2->sidedef[0]->Flags & 0x40) == 0)) {
        port->mFlags = port->mFlags & 0xef;
      }
      else {
        port->mFlags = port->mFlags | 0x10;
      }
    }
  }
  return;
}

Assistant:

void P_UpdatePortal(FLinePortal *port)
{
	if (port->mDestination == NULL)
	{
		// Portal has no destination: switch it off
		port->mFlags = 0;
	}
	else if (port->mDestination->getPortalDestination() != port->mOrigin)
	{
		//portal doesn't link back. This will be a simple teleporter portal.
		port->mFlags = port->mDefFlags & ~PORTF_INTERACTIVE;
		if (port->mType == PORTT_LINKED)
		{
			// this is illegal. Demote the type to TELEPORT
			port->mType = PORTT_TELEPORT;
			port->mDefFlags &= ~PORTF_INTERACTIVE;
		}
	}
	else
	{
		port->mFlags = port->mDefFlags;
		if (port->mType == PORTT_LINKED)
		{
			if (linePortals[port->mDestination->portalindex].mType != PORTT_LINKED)
			{
				port->mType = PORTT_INTERACTIVE;	// linked portals must be two-way.
			}
			else
			{
				port->mDisplacement = port->mDestination->v2->fPos() - port->mOrigin->v1->fPos();
			}
		}
 	}

	// Cache the angle between the two linedefs, for rotating.
	SetRotation(port);
}